

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O3

Seg_Man_t * Seg_ManAlloc(Gia_Man_t *pGia,int nFanouts)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int **ppiVar4;
  uint uVar5;
  int iVar6;
  Seg_Man_t *p;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Int_t *vToSkip;
  sat_solver *s;
  uint n;
  
  p = (Seg_Man_t *)calloc(1,0x78);
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(4000);
  pVVar7->pArray = piVar8;
  p->vPolars = pVVar7;
  vToSkip = (Vec_Int_t *)malloc(0x10);
  vToSkip->nCap = 1000;
  vToSkip->nSize = 0;
  piVar8 = (int *)malloc(4000);
  vToSkip->pArray = piVar8;
  p->vToSkip = vToSkip;
  pVVar7 = Seg_ManCountIntEdges(pGia,pVVar7,vToSkip,nFanouts);
  p->vEdges = pVVar7;
  n = pVVar7->nSize / 2;
  uVar5 = 0x1f;
  if (n - 1 != 0) {
    for (; n - 1 >> uVar5 == 0; uVar5 = uVar5 - 1) {
    }
  }
  uVar5 = (uVar5 ^ 0xffffffe0) + 0x21;
  if (n < 2) {
    uVar5 = n;
  }
  p->nVars = n;
  p->LogN = uVar5;
  p->Power2 = 1 << ((byte)uVar5 & 0x1f);
  s = sat_solver_new();
  p->pSat = s;
  sat_solver_setnvars(s,n);
  iVar6 = sat_solver_nvars(s);
  p->FirstVar = iVar6;
  if (s->qhead == s->qtail) {
    iVar2 = s->size;
    s->iVarPivot = iVar2;
    s->iTrailPivot = s->qhead;
    *(undefined8 *)(s->Mem).BookMarkE = *(undefined8 *)(s->Mem).nEntries;
    iVar3 = (s->Mem).iPage[0];
    bVar1 = (byte)(s->Mem).nPageSize;
    ppiVar4 = (s->Mem).pPages;
    (s->Mem).BookMarkH[0] = iVar3 << (bVar1 & 0x1f) | *ppiVar4[iVar3];
    iVar3 = (s->Mem).iPage[1];
    (s->Mem).BookMarkH[1] = iVar3 << (bVar1 & 0x1f) | *ppiVar4[iVar3];
    if (s->activity2 != (word *)0x0) {
      s->var_inc2 = s->var_inc;
      memcpy(s->activity2,s->activity,(long)iVar2 << 3);
    }
    p->pGia = pGia;
    pVVar7 = (Vec_Int_t *)calloc(1,0x10);
    p->vFirsts = pVVar7;
    pVVar7 = (Vec_Int_t *)calloc(1,0x10);
    p->vNvars = pVVar7;
    pVVar7 = (Vec_Int_t *)calloc(1,0x10);
    p->vLits = pVVar7;
    iVar6 = Seg_ManCountIntLevels(p,iVar6);
    sat_solver_setnvars(p->pSat,iVar6);
    Gia_ManFillValue(pGia);
    return p;
  }
  __assert_fail("s->qhead == s->qtail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                ,0x137,"void sat_solver_bookmark(sat_solver *)");
}

Assistant:

Seg_Man_t * Seg_ManAlloc( Gia_Man_t * pGia, int nFanouts )
{
    int nVarsAll;
    Seg_Man_t * p = ABC_CALLOC( Seg_Man_t, 1 );
    p->vPolars    = Vec_IntAlloc( 1000 ); 
    p->vToSkip    = Vec_IntAlloc( 1000 ); 
    p->vEdges     = Seg_ManCountIntEdges( pGia, p->vPolars, p->vToSkip, nFanouts );
    p->nVars      = Vec_IntSize(p->vEdges)/2;
    p->LogN       = Abc_Base2Log(p->nVars);
    p->Power2     = 1 << p->LogN;
    //p->pSat       = Sbm_AddCardinSolver( p->LogN, &p->vCardVars );
    p->pSat       = sat_solver_new();
    sat_solver_setnvars( p->pSat, p->nVars );
    p->FirstVar   = sat_solver_nvars( p->pSat );
    sat_solver_bookmark( p->pSat );
    p->pGia       = pGia;
    // internal
    p->vFirsts    = Vec_IntAlloc( 0 ); 
    p->vNvars     = Vec_IntAlloc( 0 ); 
    p->vLits      = Vec_IntAlloc( 0 ); 
    nVarsAll      = Seg_ManCountIntLevels( p, p->FirstVar );
    sat_solver_setnvars( p->pSat, nVarsAll );
    // other
    Gia_ManFillValue( pGia );
    return p;
}